

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

String * kj::anon_unknown_36::generateWebSocketAccept(String *__return_storage_ptr__,StringPtr key)

{
  undefined1 in_R8B;
  byte digest [20];
  SHA1_CTX local_78;
  
  digest[0] = '\0';
  digest[1] = '\0';
  digest[2] = '\0';
  digest[3] = '\0';
  digest[4] = '\0';
  digest[5] = '\0';
  digest[6] = '\0';
  digest[7] = '\0';
  digest[8] = '\0';
  digest[9] = '\0';
  digest[10] = '\0';
  digest[0xb] = '\0';
  digest[0xc] = '\0';
  digest[0xd] = '\0';
  digest[0xe] = '\0';
  digest[0xf] = '\0';
  digest[0x10] = '\0';
  digest[0x11] = '\0';
  digest[0x12] = '\0';
  digest[0x13] = '\0';
  local_78.state[0] = 0x67452301;
  local_78.state[1] = 0xefcdab89;
  local_78.state[2] = 0x98badcfe;
  local_78.state[3] = 0x10325476;
  local_78.state[4] = 0xc3d2e1f0;
  local_78.count[0] = 0;
  local_78.count[1] = 0;
  SHA1Update(&local_78,(uchar *)key.content.ptr,(int)key.content.size_ - 1);
  SHA1Update(&local_78,(anonymous_namespace)::WEBSOCKET_GUID,0x24);
  SHA1Final(digest,&local_78);
  encodeBase64(__return_storage_ptr__,(kj *)digest,(ArrayPtr<const_unsigned_char>)ZEXT816(0x14),
               (bool)in_R8B);
  return __return_storage_ptr__;
}

Assistant:

static kj::String generateWebSocketAccept(kj::StringPtr key) {
  // WebSocket demands we do a SHA-1 here. ARRGHH WHY SHA-1 WHYYYYYY?
  SHA1_CTX ctx;
  byte digest[20]{};
  SHA1Init(&ctx);
  SHA1Update(&ctx, key.asBytes().begin(), key.size());
  SHA1Update(&ctx, reinterpret_cast<const byte*>(WEBSOCKET_GUID), strlen(WEBSOCKET_GUID));
  SHA1Final(digest, &ctx);
  return kj::encodeBase64(digest);
}